

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::Impose_Rel_Coord(ChMarker *this,Coordsys *m_coord)

{
  ChQuaternion<double> *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  ChQuaternion<double> local_60;
  ChQuaternion<double> local_40;
  
  ChFrame<double>::SetCoord(&(this->super_ChFrameMoving<double>).super_ChFrame<double>,m_coord);
  dVar2 = (m_coord->pos).m_data[0];
  dVar4 = (this->super_ChObj).ChTime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[0] = dVar2 - dVar4;
  dVar2 = (m_coord->pos).m_data[1];
  dVar4 = (this->super_ChObj).ChTime;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[1] = dVar2 - dVar4;
  dVar2 = (m_coord->pos).m_data[2];
  dVar4 = (this->super_ChObj).ChTime;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[2] = dVar2 - dVar4;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->super_ChObj).ChTime;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar5,auVar3);
  Q_from_AngAxis(&local_60,auVar3._0_8_,&this->motion_axis);
  local_40.m_data[0] = local_60.m_data[0];
  local_40.m_data[1] = local_60.m_data[1];
  local_40.m_data[2] = local_60.m_data[2];
  local_40.m_data[3] = local_60.m_data[3];
  Qcross(&m_coord->rot,&local_40);
  pCVar1 = &(this->rest_coord).rot;
  if (&local_60 != pCVar1) {
    pCVar1->m_data[0] = local_60.m_data[0];
    (this->rest_coord).rot.m_data[1] = local_60.m_data[1];
    (this->rest_coord).rot.m_data[2] = local_60.m_data[2];
    (this->rest_coord).rot.m_data[3] = local_60.m_data[3];
  }
  if (this->Body != (ChBody *)0x0) {
    ChFrameMoving<double>::TransformLocalToParent
              (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,
               &this->super_ChFrameMoving<double>,&this->abs_frame);
  }
  return;
}

Assistant:

void ChMarker::Impose_Rel_Coord(const Coordsys& m_coord) {
    Quaternion qtemp;
    // set the actual coordinates
    SetCoord(m_coord);
    // set the resting position coordinates
    rest_coord.pos.x() = m_coord.pos.x() - motion_X->Get_y(ChTime);
    rest_coord.pos.y() = m_coord.pos.y() - motion_Y->Get_y(ChTime);
    rest_coord.pos.z() = m_coord.pos.z() - motion_Z->Get_y(ChTime);
    qtemp = Q_from_AngAxis(-(motion_ang->Get_y(ChTime)), motion_axis);
    rest_coord.rot = Qcross(m_coord.rot, qtemp);  // ***%%% check
                                                  // set also the absolute positions, and other.
    UpdateState();
}